

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex00m2.cpp
# Opt level: O1

int main(void)

{
  vector<int,std::allocator<int>> *this;
  iterator __position;
  int *piVar1;
  pointer pmVar2;
  mapped_type mVar3;
  istream *piVar4;
  mapped_type *pmVar5;
  _Rb_tree_node_base *p_Var6;
  ostream *poVar7;
  _Rb_tree_header *p_Var8;
  _Base_ptr p_Var9;
  iterator __position_00;
  char *pcVar10;
  _Base_ptr p_Var11;
  int iVar12;
  iterator __begin3;
  int *piVar13;
  long lVar14;
  vector<int,_std::allocator<int>_> *x;
  long lVar15;
  pointer pvVar16;
  int I;
  int U;
  int A;
  int P;
  int M;
  int N;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
  pq;
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  vm;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  user_winnings;
  vector<int,_std::allocator<int>_> v;
  unsigned_long local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  mapped_type local_b4;
  int local_b0;
  int local_ac;
  priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
  local_a8;
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_68;
  vector<int,_std::allocator<int>_> local_50;
  value_type local_38;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x1061b0) = 0;
  piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_ac);
  piVar4 = (istream *)std::istream::operator>>(piVar4,&local_b0);
  std::istream::operator>>(piVar4,&local_b8);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_50,(long)local_ac,(allocator_type *)&local_a8);
  if (0 < local_ac) {
    lVar14 = 0;
    lVar15 = 0;
    do {
      std::istream::operator>>
                ((istream *)&std::cin,
                 (int *)((long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar14));
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 4;
    } while (lVar15 < local_ac);
  }
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::vector(&local_80,(long)local_ac,(allocator_type *)&local_a8);
  if (0 < local_b8) {
    iVar12 = 0;
    do {
      std::operator>>((istream *)&std::cin,(char *)&local_68);
      if ((char)local_68.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 'B') {
        piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_bc);
        piVar4 = (istream *)std::istream::operator>>(piVar4,&local_c0);
        std::istream::operator>>(piVar4,&local_b4);
        mVar3 = local_b4;
        local_a8.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
        _M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_a8.c.
                               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,local_bc + -1);
        pmVar5 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](local_80.
                            super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + (long)local_c0 + -1,
                            (key_type *)&local_a8);
        *pmVar5 = mVar3;
      }
      else if ((char)local_68.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == 'W') {
        piVar4 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_bc);
        std::istream::operator>>(piVar4,&local_c0);
        lVar14 = (long)local_c0;
        p_Var8 = &local_80.
                  super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar14 + -1]._M_t._M_impl.
                  super__Rb_tree_header;
        p_Var9 = local_80.
                 super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar14 + -1]._M_t._M_impl.
                 super__Rb_tree_header._M_header._M_parent;
        p_Var11 = &p_Var8->_M_header;
        if (p_Var9 != (_Base_ptr)0x0) {
          do {
            if (local_bc + -1 <= (int)p_Var9[1]._M_color) {
              p_Var11 = p_Var9;
            }
            p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_bc + -1];
          } while (p_Var9 != (_Base_ptr)0x0);
        }
        __position_00._M_node = &p_Var8->_M_header;
        if (((_Rb_tree_header *)p_Var11 != p_Var8) &&
           (__position_00._M_node = p_Var11, local_bc <= (int)p_Var11[1]._M_color)) {
          __position_00._M_node = &p_Var8->_M_header;
        }
        if ((_Rb_tree_header *)__position_00._M_node != p_Var8) {
          std::
          _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
          ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                              *)(local_80.
                                 super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar14 + -1),
                             __position_00);
        }
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 < local_b8);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_68,(long)local_b0,(allocator_type *)&local_a8);
  local_c8 = 0;
  if (local_80.
      super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_80.
      super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      local_a8.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pmVar2 = local_80.
               super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_c8;
      for (p_Var6 = local_80.
                    super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_c8]._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var6 != &(pmVar2->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        local_38.second = p_Var6[1]._M_color;
        local_38.first = *(int *)&p_Var6[1].field_0x4;
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
        ::push(&local_a8,&local_38);
      }
      while ((local_a8.c.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_start !=
              local_a8.c.
              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
              .super__Vector_impl_data._M_finish &&
             (0 < local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_c8]))) {
        this = (vector<int,std::allocator<int>> *)
               (CONCAT71(local_68.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         (char)local_68.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) +
               (long)(local_a8.c.
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second * 0x18);
        __position._M_current = *(int **)(this + 8);
        if (__position._M_current == *(int **)(this + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<unsigned_long&>
                    (this,__position,&local_c8);
        }
        else {
          *__position._M_current = (int)local_c8;
          *(int **)(this + 8) = __position._M_current + 1;
        }
        std::
        priority_queue<std::pair<int,_int>,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>_>
        ::pop(&local_a8);
        local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_c8] =
             local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[local_c8] + -1;
      }
      if (local_a8.c.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.c.
                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.c.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.c.
                              super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      local_c8 = local_c8 + 1;
    } while (local_c8 <
             (ulong)(((long)local_80.
                            super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_80.
                            super__Vector_base<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555));
  }
  for (pvVar16 = (pointer)CONCAT71(local_68.
                                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                   (char)local_68.
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
      pvVar16 !=
      local_68.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; pvVar16 = pvVar16 + 1) {
    piVar13 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar1 = (pvVar16->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar1 == piVar13) {
      lVar14 = 5;
      pcVar10 = "NONE\n";
    }
    else {
      do {
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar13 + 1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
        piVar13 = piVar13 + 1;
      } while (piVar13 != piVar1);
      lVar14 = 1;
      pcVar10 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar10,lVar14);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68);
  std::
  vector<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ::~vector(&local_80);
  if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    ios::sync_with_stdio(false);
    cin.tie(0);
    int N, M, A;
    cin >> N >> M >> A;
    vector<int> v(N);
    for (int i = 0; i < N; ++i) {
        cin >> v[i];
    }
    int U, I, P;
    vector<map<int, int>> vm(N);
    for (int i = 0; i < A; ++i) {
        char action;
        cin >> action;
        switch (action) {
        case 'B':
            cin >> U >> I >> P;
            vm[I - 1][U - 1] = P;
            break;
        case 'W':
            cin >> U >> I;
            auto it = vm[I - 1].find(U - 1);
            if (it != vm[I - 1].end()) {
                vm[I - 1].erase(it);
            }
            break;
        }
    }
    vector<vector<int>> user_winnings(M);
    for (size_t e = 0; e < vm.size(); e++) {
        priority_queue<pii> pq;
        for (auto &k : vm[e]) {
            pq.push(make_pair(k.second, k.first));
        }
        while (!pq.empty() && v[e] > 0) {
            user_winnings[pq.top().second].emplace_back(e);
            pq.pop();
            v[e]--;
        }
    }
    for (auto &x : user_winnings) {
        if (x.size() > 0) {
            for (auto &y : x) {
                cout << y + 1 << " ";
            }
            cout << "\n";
        } else {
            cout << "NONE\n";
        }
    }
}